

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

void __thiscall Rml::ElementText::~ElementText(ElementText *this)

{
  ElementText *this_local;
  
  ~ElementText(this);
  operator_delete(this,0x1f8);
  return;
}

Assistant:

ElementText::~ElementText() {}